

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

void google::protobuf::compiler::annotation_test_util::FindAnnotationsOnPath
               (GeneratedCodeInfo *info,string *source_file,vector<int,_std::allocator<int>_> *path,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ulong uVar4;
  pointer piVar5;
  ulong uVar6;
  int i;
  int index;
  Annotation *annotation;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *local_40;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *local_38;
  
  index = 0;
  local_38 = annotations;
  do {
    if (*(int *)((long)&info->field_0 + 8) <= index) {
      return;
    }
    local_40 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                         ((RepeatedPtrFieldBase *)&(info->field_0)._impl_,index);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)(local_40->field_0)._impl_.source_file_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc),source_file);
    if (!bVar1) {
      iVar2 = RepeatedField<int>::size(&(local_40->field_0)._impl_.path_);
      piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      if ((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2 == (long)iVar2) {
        uVar4 = 0;
        do {
          uVar6 = uVar4;
          uVar4 = (long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          if (uVar4 <= uVar6) goto LAB_00158c43;
          iVar3 = GeneratedCodeInfo_Annotation::path(local_40,(int)uVar6);
          piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar4 = uVar6 + 1;
        } while (iVar3 == piVar5[uVar6]);
        uVar4 = (long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
LAB_00158c43:
        if (uVar4 == uVar6) {
          std::
          vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
          ::push_back(local_38,&local_40);
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

void FindAnnotationsOnPath(
    const GeneratedCodeInfo& info, const std::string& source_file,
    const std::vector<int>& path,
    std::vector<const GeneratedCodeInfo::Annotation*>* annotations) {
  for (int i = 0; i < info.annotation_size(); ++i) {
    const GeneratedCodeInfo::Annotation* annotation = &info.annotation(i);
    if (annotation->source_file() != source_file ||
        annotation->path_size() != path.size()) {
      continue;
    }
    int node = 0;
    for (; node < path.size(); ++node) {
      if (annotation->path(node) != path[node]) {
        break;
      }
    }
    if (node == path.size()) {
      annotations->push_back(annotation);
    }
  }
}